

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota.cc
# Opt level: O2

void * thread_routine(void *vparam)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  pvVar2 = (void *)0x0;
  uVar7 = 0;
  lVar6 = 0;
  do {
    if (lVar6 == 0x20000) {
      return pvVar2;
    }
    pvVar2 = (void *)((long)pvVar2 +
                     (ulong)((quota.value >> 0x16 & 0x3fffffffc00) <
                            (quota.value & 0xffffffff) << 10));
    iVar1 = rand();
    uVar8 = (ulong)(long)iVar1 % 0x3fffffffc00 + 0x3ff;
    uVar3 = uVar8 >> 10;
    if ((uint)uVar3 < (uint)quota.value) {
      uVar8 = 0xffffffffffffffff;
    }
    else {
      quota.value = quota.value & 0xffffffff | uVar3 << 0x20;
      LOCK();
      UNLOCK();
      uVar8 = uVar8 & 0x3fffffffc00;
    }
    sched_yield();
    if (0 < (long)uVar8) {
      *(ulong *)((long)vparam + 8) = uVar8;
      *(long *)((long)vparam + 0x18) = *(long *)((long)vparam + 0x18) + 1;
    }
    if ((long)uVar7 < 1) {
      iVar1 = rand();
      lVar4 = (long)iVar1 % (long)uVar8;
      uVar7 = 0xffffffffffffffff;
      if (lVar4 + 1U < 0x3fffffffc01) {
        if (lVar4 == -1) {
          __assert_fail("size_in_units",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                        ,0x89,"ssize_t quota_use(struct quota *, size_t)");
        }
        uVar5 = (uint)quota.value + (int)(lVar4 + 0x400U >> 10);
        if (uVar5 <= (uint)quota.value) {
          __assert_fail("new_used_in_units > used_in_units",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                        ,0x90,"ssize_t quota_use(struct quota *, size_t)");
        }
        if ((uint)(quota.value >> 0x20) < uVar5) {
          uVar7 = 0xffffffffffffffff;
        }
        else {
          quota.value = (ulong)uVar5 | quota.value & 0xffffffff00000000;
          LOCK();
          UNLOCK();
          uVar8 = lVar4 + 0x400U & 0x3fffffffc00;
          uVar7 = uVar8;
          if (uVar8 != 0) goto LAB_0010130c;
          uVar7 = 0;
        }
      }
    }
    else {
      uVar5 = (uint)(uVar7 + 0x3ff >> 10);
      if ((uint)quota.value < uVar5) {
        __assert_fail("size_in_units <= used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0xab,"ssize_t quota_release(struct quota *, size_t)");
      }
      quota.value = (ulong)((uint)quota.value - uVar5) | quota.value & 0xffffffff00000000;
      LOCK();
      UNLOCK();
      uVar8 = 0;
      uVar7 = 0xffffffffffffffff;
LAB_0010130c:
      *(ulong *)vparam = uVar8;
      *(long *)((long)vparam + 0x10) = *(long *)((long)vparam + 0x10) + 1;
    }
    sched_yield();
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void *thread_routine(void *vparam)
{
	struct thread_data *data = (struct thread_data *)vparam;
	size_t check_fail_count = 0;
	ssize_t allocated_size = 0;
	for (size_t i = 0; i < RUN_CNT; i++) {
		{
			size_t total, used;
			quota_get_total_and_used(&quota, &total, &used);
			if (used > total)
				check_fail_count++;
		}
		ssize_t max = rand() % QUOTA_MAX;
		max = quota_set(&quota, max);
		sched_yield();
		if (max > 0) {
			data->last_lim_set = max;
			data->lim_change_success++;
		}
		if (allocated_size > 0) {
			quota_release(&quota, allocated_size);
			allocated_size = -1;
			data->use_change = 0;
			data->use_change_success++;
			sched_yield();
		} else {
			allocated_size = rand() % max + 1;
			allocated_size = quota_use(&quota, allocated_size);
			if (allocated_size > 0) {
				data->use_change = allocated_size;
				data->use_change_success++;
			}
			sched_yield();
		}
	}
	return (void *)check_fail_count;
}